

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaspyi2c.c
# Opt level: O3

void i2c_init(i2c_state *i2c)

{
  i2c->st = IDLE;
  i2c->sda = '\x01';
  i2c->scl = '\x01';
  i2c->data = 0;
  i2c->byte = '\0';
  i2c->offset = '\0';
  i2c->addr = '\0';
  i2c->reg = '\0';
  return;
}

Assistant:

void i2c_init(struct i2c_state *i2c)
{
	i2c->st = IDLE;
	i2c->sda = 1;
	i2c->scl = 1;
	i2c->byte = 0;
	i2c->offset = 0;
	i2c->addr = 0;
	i2c->reg = 0;
	i2c->data = 0;
}